

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

void Gia_ManTerStateInsert(uint *pState,int nWords,uint **pBins,int nBins)

{
  int iVar1;
  uint *puVar2;
  int Hash;
  int nBins_local;
  uint **pBins_local;
  int nWords_local;
  uint *pState_local;
  
  iVar1 = Gia_ManTerStateHash(pState,nWords,nBins);
  puVar2 = Gia_ManTerStateLookup(pState,nWords,pBins,nBins);
  if (puVar2 == (uint *)0x0) {
    Gia_ManTerStateSetNext(pState,nWords,pBins[iVar1]);
    pBins[iVar1] = pState;
    return;
  }
  __assert_fail("!Gia_ManTerStateLookup( pState, nWords, pBins, nBins )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                ,0x13a,"void Gia_ManTerStateInsert(unsigned int *, int, unsigned int **, int)");
}

Assistant:

void Gia_ManTerStateInsert( unsigned * pState, int nWords, unsigned ** pBins, int nBins )
{
    int Hash = Gia_ManTerStateHash( pState, nWords, nBins );
    assert( !Gia_ManTerStateLookup( pState, nWords, pBins, nBins ) );
    Gia_ManTerStateSetNext( pState, nWords, pBins[Hash] );
    pBins[Hash] = pState;    
}